

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_timer.c
# Opt level: O1

void skynet_updatetime(void)

{
  uint32_t *puVar1;
  byte bVar2;
  timer_node *ptVar3;
  timer_node *ptVar4;
  timer *ptVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  timer_node *ret;
  timer_node *ptVar14;
  timespec ti;
  skynet_message local_58;
  link_list (*local_40) [64];
  ulong local_38;
  
  clock_gettime(4,(timespec *)&local_58);
  ptVar5 = TI;
  uVar8 = ((long)local_58.data / 10000000 - (long)local_58.data / -0x6769800000000000) +
          CONCAT44(local_58.session,local_58.source) * 100;
  uVar11 = TI->current_point;
  if (uVar8 < uVar11) {
    skynet_error((skynet_context *)0x0,"time diff error: change from %lld to %lld",uVar8);
    TI->current_point = uVar8;
  }
  else if (uVar8 != uVar11) {
    uVar7 = (int)uVar8 - (int)uVar11;
    TI->current_point = uVar8;
    puVar1 = &ptVar5->current;
    uVar6 = *puVar1;
    *puVar1 = *puVar1 + uVar7;
    if (CARRY4(uVar6,uVar7)) {
      puVar1 = &ptVar5->starttime;
      *puVar1 = *puVar1 + 0x28f5c28;
    }
    if (uVar7 != 0) {
      uVar6 = 0;
      ptVar5 = TI;
      do {
        do {
          LOCK();
          iVar12 = (ptVar5->lock).lock;
          (ptVar5->lock).lock = 1;
          UNLOCK();
        } while (iVar12 != 0);
        bVar2 = (byte)ptVar5->time;
        ptVar14 = ptVar5->near[bVar2].head.next;
        if (ptVar14 != (timer_node *)0x0) {
          ptVar4 = &ptVar5->near[bVar2].head;
          do {
            ((timer_node *)&ptVar4->next)->next = (timer_node *)0x0;
            ptVar4[1].next = ptVar4;
            (ptVar5->lock).lock = 0;
            do {
              local_58.source = 0;
              local_58.session = *(int *)((long)&ptVar14[1].next + 4);
              local_58.data = (void *)0x0;
              local_58.sz = 0x100000000000000;
              skynet_context_push(*(uint32_t *)&ptVar14[1].next,&local_58);
              ptVar3 = ptVar14->next;
              free(ptVar14);
              ptVar14 = ptVar3;
            } while (ptVar3 != (timer_node *)0x0);
            do {
              LOCK();
              iVar12 = (ptVar5->lock).lock;
              (ptVar5->lock).lock = 1;
              UNLOCK();
            } while (iVar12 != 0);
            ptVar14 = ptVar4->next;
          } while (ptVar14 != (timer_node *)0x0);
        }
        uVar9 = ptVar5->time + 1;
        ptVar5->time = uVar9;
        if (uVar9 == 0) {
          ptVar14 = ptVar5->t[3][0].head.next;
          ptVar5->t[3][0].head.next = (timer_node *)0x0;
          ptVar5->t[3][0].tail = (timer_node *)(ptVar5->t + 3);
          while (ptVar14 != (timer_node *)0x0) {
            ptVar4 = ptVar14->next;
            add_node(ptVar5,ptVar14);
            ptVar14 = ptVar4;
          }
        }
        else {
          uVar10 = uVar9 >> 8;
          local_40 = ptVar5->t;
          uVar11 = 0x100;
          iVar12 = 0;
          do {
            if (((int)uVar11 - 1U & uVar9) != 0) break;
            uVar13 = uVar10 & 0x3f;
            if (uVar13 == 0) {
              uVar11 = (ulong)(uint)((int)uVar11 << 6);
              uVar10 = uVar10 >> 6;
              iVar12 = iVar12 + 1;
            }
            else {
              ptVar14 = &local_40[iVar12][uVar13].head;
              ptVar4 = ((timer_node *)&ptVar14->next)->next;
              ((timer_node *)&ptVar14->next)->next = (timer_node *)0x0;
              ptVar14[1].next = ptVar14;
              while (ptVar4 != (timer_node *)0x0) {
                ptVar14 = ptVar4->next;
                local_38 = uVar11;
                add_node(ptVar5,ptVar4);
                ptVar4 = ptVar14;
                uVar11 = local_38;
              }
            }
          } while (uVar13 == 0);
        }
        bVar2 = (byte)ptVar5->time;
        ptVar14 = ptVar5->near[bVar2].head.next;
        if (ptVar14 != (timer_node *)0x0) {
          ptVar4 = &ptVar5->near[bVar2].head;
          do {
            ((timer_node *)&ptVar4->next)->next = (timer_node *)0x0;
            ptVar4[1].next = ptVar4;
            (ptVar5->lock).lock = 0;
            do {
              local_58.source = 0;
              local_58.session = *(int *)((long)&ptVar14[1].next + 4);
              local_58.data = (void *)0x0;
              local_58.sz = 0x100000000000000;
              skynet_context_push(*(uint32_t *)&ptVar14[1].next,&local_58);
              ptVar3 = ptVar14->next;
              free(ptVar14);
              ptVar14 = ptVar3;
            } while (ptVar3 != (timer_node *)0x0);
            do {
              LOCK();
              iVar12 = (ptVar5->lock).lock;
              (ptVar5->lock).lock = 1;
              UNLOCK();
            } while (iVar12 != 0);
            ptVar14 = ptVar4->next;
          } while (ptVar14 != (timer_node *)0x0);
        }
        (ptVar5->lock).lock = 0;
        uVar6 = uVar6 + 1;
        ptVar5 = TI;
      } while (uVar6 < uVar7);
    }
  }
  return;
}

Assistant:

void
skynet_updatetime(void) {
	uint64_t cp = gettime();
	if(cp < TI->current_point) {
		skynet_error(NULL, "time diff error: change from %lld to %lld", cp, TI->current_point);
		TI->current_point = cp;
	} else if (cp != TI->current_point) {
		uint32_t diff = (uint32_t)(cp - TI->current_point);
		TI->current_point = cp;

		uint32_t oc = TI->current;
		TI->current += diff;
		if (TI->current < oc) {
			// when cs > 0xffffffff(about 497 days), time rewind
			TI->starttime += 0xffffffff / 100;
		}
		int i;
		for (i=0;i<diff;i++) {
			timer_update(TI);
		}
	}
}